

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t zip_deflate_init(archive_read *a,zip *zip)

{
  long in_RSI;
  archive *in_RDI;
  wchar_t r;
  int local_1c;
  
  if (*(char *)(in_RSI + 0xc1) == '\0') {
    if (*(char *)(in_RSI + 0x148) == '\0') {
      local_1c = inflateInit2_(in_RSI + 0xd8,0xfffffff1,"1.2.11",0x70);
    }
    else {
      local_1c = inflateReset(in_RSI + 0xd8);
    }
    if (local_1c != 0) {
      archive_set_error(in_RDI,-1,"Can\'t initialize ZIP decompression.");
      return L'\xffffffe2';
    }
    *(undefined1 *)(in_RSI + 0x148) = 1;
    *(undefined1 *)(in_RSI + 0xc1) = 1;
  }
  return L'\0';
}

Assistant:

static int
zip_deflate_init(struct archive_read *a, struct zip *zip)
{
	int r;

	/* If we haven't yet read any data, initialize the decompressor. */
	if (!zip->decompress_init) {
		if (zip->stream_valid)
			r = inflateReset(&zip->stream);
		else
			r = inflateInit2(&zip->stream,
			    -15 /* Don't check for zlib header */);
		if (r != Z_OK) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Can't initialize ZIP decompression.");
			return (ARCHIVE_FATAL);
		}
		/* Stream structure has been set up. */
		zip->stream_valid = 1;
		/* We've initialized decompression for this stream. */
		zip->decompress_init = 1;
	}
	return (ARCHIVE_OK);
}